

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groups.c
# Opt level: O3

comex_igroup_t * comex_get_igroup_from_group(comex_group_t id)

{
  group_link *pgVar1;
  
  pgVar1 = group_list;
  if (group_list == (comex_igroup_t *)0x0) {
    __assert_fail("group_list != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/groups.c"
                  ,0x22,"comex_igroup_t *comex_get_igroup_from_group(comex_group_t)");
  }
  do {
    if (pgVar1->id == id) {
      return pgVar1;
    }
    pgVar1 = pgVar1->next;
  } while (pgVar1 != (group_link *)0x0);
  comex_error("comex group lookup failed",-1);
  return (comex_igroup_t *)0x0;
}

Assistant:

comex_igroup_t* comex_get_igroup_from_group(comex_group_t id)
{
    comex_igroup_t *current_group_list_item = group_list;

    assert(group_list != NULL);
    while (current_group_list_item != NULL) {
        if (current_group_list_item->id == id) {
            return current_group_list_item;
        }
        current_group_list_item = current_group_list_item->next;
    }
    comex_error("comex group lookup failed", -1);

    return NULL;
}